

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

bool __thiscall
duckdb::RowGroupCollection::Append
          (RowGroupCollection *this,DataChunk *chunk,TableAppendState *state)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  bool bVar4;
  RowGroupSegmentTree *pRVar5;
  RowGroup *pRVar6;
  ColumnStatistics *this_00;
  reference v;
  idx_t col_idx;
  ulong slice_count;
  ulong uVar7;
  ulong append_count;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  local_stats_lock;
  
  iVar1 = this->row_group_size;
  DataChunk::Verify(chunk);
  uVar7 = chunk->count;
  state->total_append_count = state->total_append_count + uVar7;
  bVar4 = false;
  slice_count = uVar7;
  while( true ) {
    pRVar6 = (state->row_group_append_state).row_group;
    append_count = iVar1 - (state->row_group_append_state).offset_in_row_group;
    if (slice_count < append_count) {
      append_count = slice_count;
    }
    if (append_count != 0) {
      iVar2 = pRVar6->allocation_size;
      RowGroup::Append(pRVar6,&state->row_group_append_state,chunk,append_count);
      this->allocation_size = this->allocation_size + (pRVar6->allocation_size - iVar2);
      RowGroup::MergeIntoStatistics(pRVar6,&this->stats);
    }
    slice_count = slice_count - append_count;
    if (slice_count == 0) break;
    if (slice_count < chunk->count) {
      DataChunk::Slice(chunk,append_count,slice_count);
    }
    iVar2 = (state->row_group_append_state).offset_in_row_group;
    iVar3 = (pRVar6->super_SegmentBase<duckdb::RowGroup>).start;
    pRVar5 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
    ::std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&local_stats_lock,
               &(pRVar5->super_SegmentTree<duckdb::RowGroup,_true>).node_lock);
    AppendRowGroup(this,(SegmentLock *)&local_stats_lock,iVar2 + iVar3);
    pRVar5 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
    pRVar6 = SegmentTree<duckdb::RowGroup,_true>::GetLastSegment
                       (&pRVar5->super_SegmentTree<duckdb::RowGroup,_true>,
                        (SegmentLock *)&local_stats_lock);
    RowGroup::InitializeAppend(pRVar6,&state->row_group_append_state);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_stats_lock);
    bVar4 = true;
  }
  state->current_row = state->current_row + uVar7;
  v = (reference)&state->stats;
  TableStatistics::GetLock((TableStatistics *)&local_stats_lock);
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)(this->types).
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             .
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->types).
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar7 = uVar7 + 1) {
    unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
    ::operator*(&local_stats_lock);
    this_00 = TableStatistics::GetStats(&state->stats,(TableStatisticsLock *)v,uVar7);
    v = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar7);
    ColumnStatistics::UpdateDistinctStatistics(this_00,v,chunk->count,&state->hashes);
  }
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr(&local_stats_lock.
                 super_unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
               );
  return bVar4;
}

Assistant:

bool RowGroupCollection::Append(DataChunk &chunk, TableAppendState &state) {
	const idx_t row_group_size = GetRowGroupSize();
	D_ASSERT(chunk.ColumnCount() == types.size());
	chunk.Verify();

	bool new_row_group = false;
	idx_t total_append_count = chunk.size();
	idx_t remaining = chunk.size();
	state.total_append_count += total_append_count;
	while (true) {
		auto current_row_group = state.row_group_append_state.row_group;
		// check how much we can fit into the current row_group
		idx_t append_count =
		    MinValue<idx_t>(remaining, row_group_size - state.row_group_append_state.offset_in_row_group);
		if (append_count > 0) {
			auto previous_allocation_size = current_row_group->GetAllocationSize();
			current_row_group->Append(state.row_group_append_state, chunk, append_count);
			allocation_size += current_row_group->GetAllocationSize() - previous_allocation_size;
			// merge the stats
			current_row_group->MergeIntoStatistics(stats);
		}
		remaining -= append_count;
		if (remaining > 0) {
			// we expect max 1 iteration of this loop (i.e. a single chunk should never overflow more than one
			// row_group)
			D_ASSERT(chunk.size() == remaining + append_count);
			// slice the input chunk
			if (remaining < chunk.size()) {
				chunk.Slice(append_count, remaining);
			}
			// append a new row_group
			new_row_group = true;
			auto next_start = current_row_group->start + state.row_group_append_state.offset_in_row_group;

			auto l = row_groups->Lock();
			AppendRowGroup(l, next_start);
			// set up the append state for this row_group
			auto last_row_group = row_groups->GetLastSegment(l);
			last_row_group->InitializeAppend(state.row_group_append_state);
			continue;
		} else {
			break;
		}
	}
	state.current_row += row_t(total_append_count);

	auto local_stats_lock = state.stats.GetLock();

	for (idx_t col_idx = 0; col_idx < types.size(); col_idx++) {
		auto &column_stats = state.stats.GetStats(*local_stats_lock, col_idx);
		column_stats.UpdateDistinctStatistics(chunk.data[col_idx], chunk.size(), state.hashes);
	}

	return new_row_group;
}